

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

TracedDictionary * __thiscall
perfetto::TracedValue::WriteDictionary(TracedDictionary *__return_storage_ptr__,TracedValue *this)

{
  DebugAnnotation *message;
  EventContext *event_context;
  CheckedScope *parent_scope;
  TracedValue *this_local;
  
  internal::CheckedScope::Reset((CheckedScope *)&this->field_0x10);
  message = this->annotation_;
  event_context = this->event_context_;
  parent_scope = internal::CheckedScope::parent_scope((CheckedScope *)&this->field_0x10);
  TracedDictionary::
  TracedDictionary<perfetto::protos::pbzero::DebugAnnotation,_protozero::proto_utils::FieldMetadata<11U,_(protozero::proto_utils::RepetitionType)2,_(protozero::proto_utils::ProtoSchemaType)11,_perfetto::protos::pbzero::DebugAnnotation,_perfetto::protos::pbzero::DebugAnnotation>_>
            (__return_storage_ptr__,message,protos::pbzero::DebugAnnotation::kDictEntries,
             event_context,parent_scope);
  return __return_storage_ptr__;
}

Assistant:

TracedDictionary TracedValue::WriteDictionary() && {
  // Note: this passes |checked_scope_.is_active_| bit to the parent to be
  // picked up later by the new TracedDictionary.
  PERFETTO_DCHECK(checked_scope_.is_active());
  checked_scope_.Reset();

  PERFETTO_DCHECK(!annotation_->is_finalized());
  return TracedDictionary(annotation_,
                          protos::pbzero::DebugAnnotation::kDictEntries,
                          event_context_, checked_scope_.parent_scope());
}